

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaLiteTest_Swap_Test::TestBody
          (Proto3ArenaLiteTest_Swap_Test *this)

{
  bool bVar1;
  TestAllTypes *this_00;
  char *pcVar2;
  AssertHelper local_1e0;
  Message local_1d8;
  Arena *local_1d0;
  Arena *local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  Message local_1a8;
  Arena *local_1a0;
  CachedBlock ***local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  TestAllTypes *arena2_message;
  TestAllTypes *arena1_message;
  undefined1 local_160 [8];
  Arena arena2;
  Arena arena1;
  Proto3ArenaLiteTest_Swap_Test *this_local;
  
  Arena::Arena((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  Arena::Arena((Arena *)local_160);
  this_00 = Arena::Create<proto3_arena_unittest::TestAllTypes>
                      ((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Arena::Create<proto3_arena_unittest::TestAllTypes>((Arena *)local_160);
  proto3_arena_unittest::TestAllTypes::Swap
            (this_00,(TestAllTypes *)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  local_198 = &arena2.impl_.first_arena_.cached_blocks_;
  local_1a0 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_190,"&arena1","arena1_message->GetArena()",(Arena **)&local_198,
             &local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_lite_unittest.cc"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1c8 = (Arena *)local_160;
  local_1d0 = protobuf::MessageLite::GetArena
                        ((MessageLite *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_1c0,"&arena2","arena2_message->GetArena()",&local_1c8,&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_lite_unittest.cc"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  Arena::~Arena((Arena *)local_160);
  Arena::~Arena((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  return;
}

Assistant:

TEST(Proto3ArenaLiteTest, Swap) {
  Arena arena1;
  Arena arena2;

  // Test Swap().
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
  arena1_message->Swap(arena2_message);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
}